

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void escaped(tgestate_t *state)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  screenlocstring_t *psVar4;
  uint uVar5;
  char *pcharacter;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  screen_reset(state);
  puVar3 = (state->speccy->screen).pixels + 0x6e;
  lVar7 = 0;
  do {
    puVar3 = plot_glyph(state,"WELL DONE" + lVar7,puVar3);
    lVar7 = lVar7 + 1;
  } while ((int)lVar7 != 9);
  puVar3 = (state->speccy->screen).pixels + 0xaa;
  lVar7 = 0;
  do {
    puVar3 = plot_glyph(state,"YOU HAVE ESCAPED" + lVar7,puVar3);
    lVar7 = lVar7 + 1;
  } while ((int)lVar7 != 0x10);
  puVar3 = (state->speccy->screen).pixels + 0xcc;
  lVar7 = 0;
  do {
    puVar3 = plot_glyph(state,"FROM THE CAMP" + lVar7,puVar3);
    lVar7 = lVar7 + 1;
  } while ((int)lVar7 != 0xd);
  bVar1 = state->items_held[0];
  if (bVar1 < 0xe) {
    if (bVar1 == 3) {
      uVar6 = 2;
    }
    else if (bVar1 == 6) {
      uVar6 = 8;
    }
    else {
LAB_00107d83:
      uVar6 = 0;
    }
  }
  else if (bVar1 == 0xe) {
    uVar6 = 4;
  }
  else {
    uVar6 = 1;
    if (bVar1 != 0xf) goto LAB_00107d83;
  }
  bVar1 = state->items_held[1];
  if (bVar1 < 0xe) {
    if (bVar1 == 3) {
      uVar5 = 2;
      goto LAB_00107dcf;
    }
    if (bVar1 == 6) {
      uVar5 = 8;
      goto LAB_00107dcf;
    }
  }
  else {
    if (bVar1 == 0xe) {
      uVar5 = 4;
      goto LAB_00107dcf;
    }
    uVar5 = 1;
    if (bVar1 == 0xf) goto LAB_00107dcf;
  }
  uVar5 = 0;
LAB_00107dcf:
  uVar5 = uVar5 | uVar6;
  if (uVar5 == 3) {
    bVar8 = false;
  }
  else if (uVar5 == 5) {
    puVar3 = (state->speccy->screen).pixels + 0x809;
    lVar7 = 0;
    do {
      puVar3 = plot_glyph(state,"AND WILL CROSS THE" + lVar7,puVar3);
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 0x12);
    puVar3 = (state->speccy->screen).pixels + 0x829;
    lVar7 = 0;
    do {
      puVar3 = plot_glyph(state,"BORDER SUCCESSFULLY" + lVar7,puVar3);
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 0x13);
    bVar8 = true;
  }
  else {
    puVar3 = (state->speccy->screen).pixels + 0x809;
    lVar7 = 0;
    do {
      puVar3 = plot_glyph(state,"BUT WERE RECAPTURED" + lVar7,puVar3);
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 0x13);
    if (uVar5 < 8) {
      if (uVar5 == 0) {
        psVar4 = escaped::messages + 7;
      }
      else {
        psVar4 = (screenlocstring_t *)
                 ((long)&escaped::messages[8].screenloc + (ulong)((uVar5 & 1) << 4));
      }
    }
    else {
      psVar4 = escaped::messages + 6;
    }
    puVar3 = (state->speccy->screen).pixels + psVar4->screenloc;
    uVar6 = (uint)psVar4->length;
    pcharacter = psVar4->string;
    do {
      puVar3 = plot_glyph(state,pcharacter,puVar3);
      uVar6 = uVar6 - 1;
      pcharacter = pcharacter + 1;
    } while (uVar6 != 0);
    bVar8 = 7 < uVar5;
  }
  puVar3 = (state->speccy->screen).pixels + 0x100d;
  lVar7 = 0;
  do {
    puVar3 = plot_glyph(state,"PRESS ANY KEY" + lVar7,puVar3);
    lVar7 = lVar7 + 1;
  } while ((int)lVar7 != 0xd);
  do {
    uVar2 = keyscan_all(state);
  } while (uVar2 != '\0');
  do {
    uVar2 = keyscan_all(state);
  } while (uVar2 == '\0');
  if (!bVar8) {
    solitary(state);
    return;
  }
  reset_game(state);
  return;
}

Assistant:

void escaped(tgestate_t *state)
{
  /**
   * $A5CE: Escape messages.
   */
  static const screenlocstring_t messages[11] =
  {
    { 0x006E,  9, "WELL DONE"             },
    { 0x00AA, 16, "YOU HAVE ESCAPED"      },
    { 0x00CC, 13, "FROM THE CAMP"         },
    { 0x0809, 18, "AND WILL CROSS THE"    },
    { 0x0829, 19, "BORDER SUCCESSFULLY"   },
    { 0x0809, 19, "BUT WERE RECAPTURED"   },
    { 0x082A, 17, "AND SHOT AS A SPY"     },
    { 0x0829, 18, "TOTALLY UNPREPARED"    },
    { 0x082C, 12, "TOTALLY LOST"          },
    { 0x0828, 21, "DUE TO LACK OF PAPERS" },
    { 0x100D, 13, "PRESS ANY KEY"         },
  };

  const screenlocstring_t *message;   /* was HL */
  escapeitem_t             itemflags; /* was C */
  uint8_t                  keys;      /* was A */

  assert(state != NULL);

  screen_reset(state);

  /* Print standard prefix messages. */
  message = &messages[0];
  message = screenlocstring_plot(state, message); /* WELL DONE */
  message = screenlocstring_plot(state, message); /* YOU HAVE ESCAPED */
  (void) screenlocstring_plot(state, message);    /* FROM THE CAMP */

  /* Form escape items bitfield. */
  itemflags = item_to_escapeitem(state->items_held[0]) |
              item_to_escapeitem(state->items_held[1]);

  /*         Items                     Message
   *    Unf Pur Ppr Cmp                -------
   *    ---+---+---+---
   *  0  .   .   .   .  "BUT WERE RECAPTURED TOTALLY UNPREPARED" (lose)
   *  1  .   .   .   X  "BUT WERE RECAPTURED DUE TO LACK OF PAPERS" (lose)
   *  2  .   .   X   .  "BUT WERE RECAPTURED TOTALLY LOST" (lose)
   *  3  .   .   X   X  (the game offers no extra message) (win)
   *  4  .   X   .   .  "BUT WERE RECAPTURED TOTALLY LOST" (lose)
   *  5  .   X   .   X  "AND WILL CROSS THE BORDER SUCCESSFULLY" (win)
   *  6  .   X   X   .  "BUT WERE RECAPTURED TOTALLY LOST" (lose)
   *  8  X   .   .   .  "BUT WERE RECAPTURED AND SHOT AS A SPY" (lose)
   *  9  X   .   .   X  "BUT WERE RECAPTURED AND SHOT AS A SPY" (lose)
   * 10  X   .   X   .  "BUT WERE RECAPTURED AND SHOT AS A SPY" (lose)
   * 12  X   X   .   .  "BUT WERE RECAPTURED AND SHOT AS A SPY" (lose)
   */

  /* Print item-tailored messages. */
  if (itemflags == (escapeitem_COMPASS | escapeitem_PURSE))
  {
    message = &messages[3];
    message = screenlocstring_plot(state, message); /* AND WILL CROSS THE */
    (void) screenlocstring_plot(state, message);    /* BORDER SUCCESSFULLY */

    itemflags = 0xFF; /* success - reset game */
  }
  else if (itemflags != (escapeitem_COMPASS | escapeitem_PAPERS))
  {
    message = &messages[5]; /* BUT WERE RECAPTURED */
    message = screenlocstring_plot(state, message);

    /* Have uniform => AND SHOT AS A SPY. */

    if (itemflags < escapeitem_UNIFORM)
    {
      /* No items => TOTALLY UNPREPARED. */
      message = &messages[7];
      if (itemflags)
      {
        /* No compass => TOTALLY LOST. */
        message = &messages[8];
        if (itemflags & escapeitem_COMPASS)
        {
          /* No papers => DUE TO LACK OF PAPERS. */
          message = &messages[9];
        }
      }
    }
    (void) screenlocstring_plot(state, message);
  }

  message = &messages[10]; /* PRESS ANY KEY */
  (void) screenlocstring_plot(state, message);

  /* Debounce: First wait for any already-held key to be released. */
  do
    keys = keyscan_all(state);
  while (keys != 0); /* Down press */
  /* Then wait for any key to be pressed. */
  do
    keys = keyscan_all(state);
  while (keys == 0); /* Up press */

  /* Reset the game, or send the hero to solitary. */
  if (itemflags == 0xFF || itemflags >= escapeitem_UNIFORM)
    reset_game(state); /* was tail call */
  else
    solitary(state); /* was tail call */
}